

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O0

void expand_list(dmr_C *C,token **list)

{
  int iVar1;
  token *ptVar2;
  token *next;
  token **list_local;
  dmr_C *C_local;
  
  next = (token *)list;
  while (ptVar2 = scan_next(C,(token **)next), ptVar2 != &dmrC_eof_token_entry_) {
    if (((SUB84(ptVar2->pos,0) & 0x3f) != 2) ||
       (iVar1 = expand_one_symbol(C,(token **)next), iVar1 != 0)) {
      next = (token *)&ptVar2->next;
    }
  }
  return;
}

Assistant:

static void expand_list(struct dmr_C *C, struct token **list)
{
	struct token *next;
	while (!dmrC_eof_token(next = scan_next(C, list))) {
		if (dmrC_token_type(next) != TOKEN_IDENT || expand_one_symbol(C, list))
			list = &next->next;
	}
}